

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

int32_t __thiscall icu_63::SkippedState::backwardNumCodePoints(SkippedState *this,int32_t n)

{
  int32_t iVar1;
  int32_t beyond;
  int32_t length;
  int32_t n_local;
  SkippedState *this_local;
  
  iVar1 = icu_63::UnicodeString::length(&this->oldBuffer);
  this_local._4_4_ = this->pos - iVar1;
  if (this_local._4_4_ < 1) {
    iVar1 = icu_63::UnicodeString::moveIndex32(&this->oldBuffer,this->pos,-n);
    this->pos = iVar1;
    this_local._4_4_ = 0;
  }
  else if (this_local._4_4_ < n) {
    iVar1 = icu_63::UnicodeString::moveIndex32(&this->oldBuffer,iVar1,this_local._4_4_ - n);
    this->pos = iVar1;
  }
  else {
    this->pos = this->pos - n;
    this_local._4_4_ = n;
  }
  return this_local._4_4_;
}

Assistant:

int32_t backwardNumCodePoints(int32_t n) {
        int32_t length = oldBuffer.length();
        int32_t beyond = pos - length;
        if(beyond > 0) {
            if(beyond >= n) {
                // Not back far enough to re-enter the oldBuffer.
                pos -= n;
                return n;
            } else {
                // Back out all beyond-oldBuffer code points and re-enter the buffer.
                pos = oldBuffer.moveIndex32(length, beyond - n);
                return beyond;
            }
        } else {
            // Go backwards from inside the oldBuffer.
            pos = oldBuffer.moveIndex32(pos, -n);
            return 0;
        }
    }